

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O0

int __thiscall ncnn::LSTM::forward(LSTM *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  float *__src;
  float *__src_00;
  float *__dest;
  Allocator *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float *ptr;
  float *pr;
  float *pf;
  int i;
  int ret1;
  int ret0;
  Mat top_blob_reverse;
  Mat top_blob_forward;
  int ret;
  Mat cell;
  Mat hidden;
  int num_directions;
  int T;
  Allocator *in_stack_fffffffffffffb58;
  Mat *in_stack_fffffffffffffb60;
  Allocator *in_stack_fffffffffffffb68;
  float _v;
  Mat *in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  Mat *in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  int local_404;
  Mat *in_stack_fffffffffffffd70;
  Mat *in_stack_fffffffffffffd78;
  Mat *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd8c;
  Mat *in_stack_fffffffffffffd90;
  Mat *in_stack_fffffffffffffd98;
  Mat *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  Option *in_stack_fffffffffffffdc0;
  Mat local_1f8 [4];
  int local_d4;
  Mat local_d0;
  int local_88;
  Allocator local_78 [9];
  int local_30;
  int local_2c;
  undefined8 local_28;
  Mat *local_20;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x30);
  local_30 = (*(int *)(in_RDI + 0xd8) == 2) + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  ncnn::Mat::Mat(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                 (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb60);
  if (bVar1) {
    local_4 = -100;
    local_88 = 1;
    goto LAB_0051f5aa;
  }
  ncnn::Mat::fill(in_stack_fffffffffffffb70,(float)((ulong)in_stack_fffffffffffffb68 >> 0x20));
  ncnn::Mat::Mat(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                 (size_t)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb60);
  if (bVar1) {
    local_4 = -100;
    local_88 = 1;
  }
  else {
    ncnn::Mat::fill(in_stack_fffffffffffffb70,(float)((ulong)in_stack_fffffffffffffb68 >> 0x20));
    ncnn::Mat::create(in_stack_fffffffffffffb80,(int)((ulong)in_stack_fffffffffffffb78 >> 0x20),
                      (int)in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,
                      in_stack_fffffffffffffb68);
    iVar3 = (int)((ulong)in_stack_fffffffffffffb80 >> 0x20);
    bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb60);
    if (bVar1) {
      local_4 = -100;
      local_88 = 1;
    }
    else {
      if ((*(int *)(in_RDI + 0xd8) == 0) || (*(int *)(in_RDI + 0xd8) == 1)) {
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                           iVar3);
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                           iVar3);
        ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                           iVar3);
        in_stack_fffffffffffffb60 = &local_d0;
        in_stack_fffffffffffffb58 = local_78;
        in_stack_fffffffffffffb68 = local_28;
        iVar2 = lstm(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,
                     in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                     in_stack_fffffffffffffdb0,
                     (Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                     in_stack_fffffffffffffdc0);
        ncnn::Mat::~Mat((Mat *)0x51ef0e);
        ncnn::Mat::~Mat((Mat *)0x51ef1b);
        ncnn::Mat::~Mat((Mat *)0x51ef28);
        local_d4 = iVar2;
        if (iVar2 != 0) {
          local_88 = 1;
          local_4 = iVar2;
          goto LAB_0051f58c;
        }
      }
      if (*(int *)(in_RDI + 0xd8) == 2) {
        ncnn::Mat::Mat(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                       (int)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                       in_stack_fffffffffffffb58);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb60);
        if (bVar1) {
          local_4 = -100;
          local_88 = 1;
        }
        else {
          ncnn::Mat::Mat(in_stack_fffffffffffffb70,(int)((ulong)in_stack_fffffffffffffb68 >> 0x20),
                         (int)in_stack_fffffffffffffb68,(size_t)in_stack_fffffffffffffb60,
                         in_stack_fffffffffffffb58);
          bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffb60);
          if (bVar1) {
            local_4 = -100;
            local_88 = 1;
          }
          else {
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                               iVar3);
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                               iVar3);
            ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                               iVar3);
            _v = local_28._4_4_;
            iVar2 = lstm(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                         in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80,
                         in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                         in_stack_fffffffffffffdb0,
                         (Mat *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                         in_stack_fffffffffffffdc0);
            ncnn::Mat::~Mat((Mat *)0x51f1ae);
            ncnn::Mat::~Mat((Mat *)0x51f1bb);
            ncnn::Mat::~Mat((Mat *)0x51f1c8);
            if (iVar2 == 0) {
              ncnn::Mat::fill(in_stack_fffffffffffffb70,_v);
              ncnn::Mat::fill(in_stack_fffffffffffffb70,_v);
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88
                                                ),iVar3);
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88
                                                ),iVar3);
              ncnn::Mat::channel((Mat *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88
                                                ),iVar3);
              iVar3 = lstm(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                           in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80,
                           in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                           in_stack_fffffffffffffdb0,
                           (Mat *)CONCAT44(iVar2,in_stack_fffffffffffffdb8),
                           in_stack_fffffffffffffdc0);
              ncnn::Mat::~Mat((Mat *)0x51f364);
              ncnn::Mat::~Mat((Mat *)0x51f371);
              ncnn::Mat::~Mat((Mat *)0x51f37e);
              if (iVar3 == 0) {
                for (local_404 = 0; local_404 < local_2c; local_404 = local_404 + 1) {
                  __src = ncnn::Mat::row(local_1f8,local_404);
                  __src_00 = ncnn::Mat::row((Mat *)&stack0xfffffffffffffdc0,local_404);
                  __dest = ncnn::Mat::row(local_20,local_404);
                  memcpy(__dest,__src,(long)*(int *)(in_RDI + 0xd0) << 2);
                  memcpy(__dest + *(int *)(in_RDI + 0xd0),__src_00,
                         (long)*(int *)(in_RDI + 0xd0) << 2);
                }
                local_88 = 0;
              }
              else {
                local_88 = 1;
                local_4 = iVar3;
              }
            }
            else {
              local_88 = 1;
              local_4 = iVar2;
            }
          }
          ncnn::Mat::~Mat((Mat *)0x51f53e);
        }
        ncnn::Mat::~Mat((Mat *)0x51f54b);
        if (local_88 != 0) goto LAB_0051f58c;
      }
      local_4 = 0;
      local_88 = 1;
    }
  }
LAB_0051f58c:
  ncnn::Mat::~Mat((Mat *)0x51f599);
LAB_0051f5aa:
  ncnn::Mat::~Mat((Mat *)0x51f5b7);
  return local_4;
}

Assistant:

int LSTM::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(num_output, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret0 != 0)
            return ret0;

        hidden.fill(0.0f);
        cell.fill(0.0f);

        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden, cell, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}